

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chull.cpp
# Opt level: O2

bool masc::polygon::inHull
               (ply_vertex *v,
               list<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_> *hull
               )

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  bool bVar3;
  int iVar4;
  _Self __tmp_2;
  Point2d *pPVar5;
  Point2d *pPVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _Self __tmp_1;
  _Self __tmp;
  
  p_Var1 = (hull->
           super__List_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
           )._M_impl._M_node.super__List_node_base._M_prev;
  pPVar5 = (Point2d *)(*(code *)(p_Var1->_M_prev[1]._M_next)->_M_next[1]._M_next)();
  pPVar6 = (Point2d *)(*(code *)(p_Var1[1]._M_next)->_M_next[1]._M_next)();
  iVar4 = (*v->_vptr_ply_vertex[2])(v);
  bVar3 = turn_left(pPVar5,pPVar6,(Point2d *)CONCAT44(extraout_var,iVar4));
  if (bVar3) {
    p_Var1 = (hull->
             super__List_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
             )._M_impl._M_node.super__List_node_base._M_next;
    p_Var2 = p_Var1->_M_next;
    pPVar5 = (Point2d *)(**(code **)((long)(p_Var1[1]._M_next)->_M_next + 0x10))();
    pPVar6 = (Point2d *)(**(code **)(*(long *)p_Var2[1]._M_next + 0x10))();
    iVar4 = (*v->_vptr_ply_vertex[2])(v);
    bVar3 = turn_left(pPVar5,pPVar6,(Point2d *)CONCAT44(extraout_var_00,iVar4));
    return bVar3;
  }
  return false;
}

Assistant:

inline bool inHull(ply_vertex * v,list<ply_vertex*>& hull )
{
    typedef list<ply_vertex*>::iterator VIT;
    VIT t1=hull.end(); t1--;
    VIT t2=t1; t2--;
    if( !turn_left((*t2)->getPos(),(*t1)->getPos(),v->getPos()) )
        return false;

    VIT b1=hull.begin();
    VIT b2=b1; b2++;
    return turn_left((*b1)->getPos(),(*b2)->getPos(),v->getPos());
}